

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CCamera::OnRender(CCamera *this)

{
  int iVar1;
  IClient *pIVar2;
  CConfig *pCVar3;
  vector2_base<float> *a;
  long in_RDI;
  vector2_base<float> *v;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vector2_base<float> vVar8;
  float XVal;
  float Distance;
  float RotPerTick;
  float OffsetAmount;
  float FollowFactor;
  float DeadZone;
  float l;
  float CameraStabilizingFactor;
  float CameraSpeed;
  float DeltaTime;
  vec2 TargetPos;
  vec2 TargetCameraOffset;
  vector2_base<float> *in_stack_fffffffffffffed8;
  vector2_base<float> *in_stack_fffffffffffffee0;
  CControls *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  vector2_base<float> local_20;
  vec2 local_18;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = CComponent::Client((CComponent *)0x14ab86);
  iVar1 = IClient::State(pIVar2);
  if (iVar1 != 3) {
    pIVar2 = CComponent::Client((CComponent *)0x14ab9d);
    iVar1 = IClient::State(pIVar2);
    if (iVar1 != 4) {
      *(undefined4 *)(in_RDI + 0x28) = 0x3f333333;
      if ((OnRender()::Dir == '\0') && (iVar1 = __cxa_guard_acquire(&OnRender()::Dir), iVar1 != 0))
      {
        vector2_base<float>::vector2_base(&OnRender::Dir,1.0,0.0);
        __cxa_guard_release(&OnRender()::Dir);
      }
      fVar4 = distance<float>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pCVar3 = CComponent::Config((CComponent *)0x14b1ab);
      if ((float)pCVar3->m_ClRotationRadius + 0.5 < fVar4) {
        v = (vector2_base<float> *)(in_RDI + 0x8c);
        a = (vector2_base<float> *)(in_RDI + 0x20);
        vector2_base<float>::operator-
                  ((vector2_base<float> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),v);
        OnRender::Dir = normalize(in_stack_fffffffffffffed8);
        CComponent::Config((CComponent *)0x14b334);
        vector2_base<float>::operator*
                  ((vector2_base<float> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float)((ulong)v >> 0x20));
        vector2_base<float>::operator+
                  ((vector2_base<float> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),v);
        distance<float>(a,in_stack_fffffffffffffed8);
        pIVar2 = CComponent::Client((CComponent *)0x14b391);
        fVar4 = IClient::RenderFrameTime(pIVar2);
        pCVar3 = CComponent::Config((CComponent *)0x14b3a9);
        *(float *)(in_RDI + 0x94) =
             *(float *)(in_RDI + 0x94) + (fVar4 * (float)pCVar3->m_ClCameraSpeed) / 10.0;
        std::pow((double)(ulong)(uint)(1.0 - *(float *)(in_RDI + 0x94)),5.37751863042469e-315);
        vector2_base<float>::operator*
                  ((vector2_base<float> *)CONCAT44(fVar4,in_stack_fffffffffffffef0),
                   (float)((ulong)v >> 0x20));
        vVar8 = vector2_base<float>::operator+
                          ((vector2_base<float> *)CONCAT44(fVar4,in_stack_fffffffffffffef0),v);
        *(vector2_base<float> *)(in_RDI + 0x10) = vVar8;
      }
      else {
        CComponent::Config((CComponent *)0x14b1d8);
        pIVar2 = CComponent::Client((CComponent *)0x14b1fc);
        IClient::RenderFrameTime(pIVar2);
        OnRender::Dir =
             rotate<float>((vector2_base<float> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        CComponent::Config((CComponent *)0x14b25c);
        vector2_base<float>::operator*
                  ((vector2_base<float> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        vVar8 = vector2_base<float>::operator+
                          ((vector2_base<float> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (vector2_base<float> *)in_stack_fffffffffffffee8);
        *(vector2_base<float> *)(in_RDI + 0x10) = vVar8;
      }
      goto LAB_0014b467;
    }
  }
  *(undefined4 *)(in_RDI + 0x28) = 0x3f800000;
  if ((((*(byte *)(*(long *)(in_RDI + 8) + 0x1628) & 1) == 0) ||
      ((*(byte *)(*(long *)(in_RDI + 8) + 0x1634) & 1) != 0)) ||
     ((*(int *)(*(long *)(in_RDI + 8) + 0x162c) != 0 &&
      ((*(long *)(*(long *)(in_RDI + 8) + 0xdd0) == 0 ||
       ((**(uint **)(*(long *)(in_RDI + 8) + 0xdd0) & 0x10) != 0)))))) {
    if (*(int *)(in_RDI + 0x2c) != 1) {
      CControls::ClampMousePos(in_stack_fffffffffffffee8);
      *(undefined4 *)(in_RDI + 0x2c) = 1;
    }
    pIVar2 = CComponent::Client((CComponent *)0x14acb8);
    fVar4 = IClient::RenderFrameTime(pIVar2);
    if ((OnRender()::s_LastMousePos == '\0') &&
       (iVar1 = __cxa_guard_acquire(&OnRender()::s_LastMousePos), iVar1 != 0)) {
      vector2_base<float>::vector2_base(&OnRender::s_LastMousePos,0.0,0.0);
      __cxa_guard_release(&OnRender()::s_LastMousePos);
    }
    if ((OnRender()::s_CurrentCameraOffset == '\0') &&
       (iVar1 = __cxa_guard_acquire(&OnRender()::s_CurrentCameraOffset), iVar1 != 0)) {
      vector2_base<float>::vector2_base(&OnRender::s_CurrentCameraOffset,0.0,0.0);
      __cxa_guard_release(&OnRender()::s_CurrentCameraOffset);
    }
    pCVar3 = CComponent::Config((CComponent *)0x14ad47);
    if (0 < pCVar3->m_ClCameraSmoothness) {
      pCVar3 = CComponent::Config((CComponent *)0x14ad5b);
      fVar5 = (1.0 - (float)pCVar3->m_ClCameraSmoothness / 100.0) * 9.5 + 0.5;
      pCVar3 = CComponent::Config((CComponent *)0x14ada0);
      iVar1 = pCVar3->m_ClCameraStabilizing;
      OnRender::s_SpeedBias = fVar5 * fVar4 + OnRender::s_SpeedBias;
      pCVar3 = CComponent::Config((CComponent *)0x14adf4);
      if (pCVar3->m_ClDynamicCamera == 0) {
        OnRender::s_SpeedBias = maximum<float>(5.0,fVar5);
      }
      else {
        local_10 = vector2_base<float>::operator-
                             ((vector2_base<float> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (vector2_base<float> *)in_stack_fffffffffffffee8);
        fVar6 = length((vector2_base<float> *)0x14ae34);
        fVar7 = log10f((float)iVar1 / 100.0 + 1.0);
        OnRender::s_SpeedBias = -(fVar6 * fVar7) * 0.02 + OnRender::s_SpeedBias;
        OnRender::s_SpeedBias = clamp<float>(OnRender::s_SpeedBias,0.5,fVar5);
      }
    }
    vector2_base<float>::vector2_base(&local_18,0.0,0.0);
    OnRender::s_LastMousePos = *(vec2 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b1f8) + 0x10);
    fVar5 = length((vector2_base<float> *)0x14af47);
    pCVar3 = CComponent::Config((CComponent *)0x14af57);
    if ((pCVar3->m_ClDynamicCamera != 0) && (0.0001 < fVar5)) {
      pCVar3 = CComponent::Config((CComponent *)0x14af82);
      iVar1 = pCVar3->m_ClMouseDeadzone;
      CComponent::Config((CComponent *)0x14af97);
      maximum<float>(fVar5 - (float)iVar1,0.0);
      local_28 = normalize(in_stack_fffffffffffffed8);
      local_20 = vector2_base<float>::operator*
                           ((vector2_base<float> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      local_18 = local_20;
    }
    pCVar3 = CComponent::Config((CComponent *)0x14b02e);
    if (pCVar3->m_ClCameraSmoothness < 1) {
      OnRender::s_CurrentCameraOffset = local_18;
    }
    else {
      vector2_base<float>::operator-
                ((vector2_base<float> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (vector2_base<float> *)in_stack_fffffffffffffee8);
      minimum<float>(fVar4 * OnRender::s_SpeedBias,1.0);
      local_30 = vector2_base<float>::operator*
                           ((vector2_base<float> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (float)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      vector2_base<float>::operator+=(&OnRender::s_CurrentCameraOffset,&local_30);
    }
    if ((*(byte *)(*(long *)(in_RDI + 8) + 0x1628) & 1) == 0) {
      vVar8 = vector2_base<float>::operator+
                        ((vector2_base<float> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (vector2_base<float> *)in_stack_fffffffffffffee8);
      *(vector2_base<float> *)(in_RDI + 0x10) = vVar8;
    }
    else {
      vVar8 = vector2_base<float>::operator+
                        ((vector2_base<float> *)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (vector2_base<float> *)in_stack_fffffffffffffee8);
      *(vector2_base<float> *)(in_RDI + 0x10) = vVar8;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x2c) != 0) {
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b1f8) + 0x10) =
           *(undefined8 *)(in_RDI + 0x30);
      CControls::ClampMousePos(in_stack_fffffffffffffee8);
      *(undefined4 *)(in_RDI + 0x2c) = 0;
    }
    *(undefined8 *)(in_RDI + 0x10) =
         *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b1f8) + 0x10);
  }
LAB_0014b467:
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCamera::OnRender()
{
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Zoom = 1.0f;

		// update camera center
		if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition &&
			(m_pClient->m_Snap.m_SpecInfo.m_SpecMode == SPEC_FREEVIEW || (m_pClient->m_Snap.m_pLocalInfo && !(m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))))
		{
			if(m_CamType != CAMTYPE_SPEC)
			{
				m_pClient->m_pControls->m_MousePos = m_PrevCenter;
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_SPEC;
			}
			m_Center = m_pClient->m_pControls->m_MousePos;
		}
		else
		{
			if(m_CamType != CAMTYPE_PLAYER)
			{
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_PLAYER;
			}

			float DeltaTime = Client()->RenderFrameTime();
			static vec2 s_LastMousePos(0, 0);
			static vec2 s_CurrentCameraOffset(0, 0);
			static float s_SpeedBias = 0.5f;

			if(Config()->m_ClCameraSmoothness > 0)
			{
				float CameraSpeed = (1.0f - (Config()->m_ClCameraSmoothness / 100.0f)) * 9.5f + 0.5f;
				float CameraStabilizingFactor = 1 + Config()->m_ClCameraStabilizing / 100.0f;

				s_SpeedBias += CameraSpeed * DeltaTime;
				if(Config()->m_ClDynamicCamera)
				{
					s_SpeedBias -= length(m_pClient->m_pControls->m_MousePos - s_LastMousePos) * log10f(CameraStabilizingFactor) * 0.02f;
					s_SpeedBias = clamp(s_SpeedBias, 0.5f, CameraSpeed);
				}
				else
				{
					s_SpeedBias = maximum(5.0f, CameraSpeed); // make sure toggle back is fast
				}
			}

			vec2 TargetCameraOffset(0, 0);
			s_LastMousePos = m_pClient->m_pControls->m_MousePos;
			float l = length(s_LastMousePos);
			if(Config()->m_ClDynamicCamera && l > 0.0001f) // make sure that this isn't 0
			{
				float DeadZone = Config()->m_ClMouseDeadzone;
				float FollowFactor = Config()->m_ClMouseFollowfactor/100.0f;
				float OffsetAmount = maximum(l-DeadZone, 0.0f) * FollowFactor;

				TargetCameraOffset = normalize(m_pClient->m_pControls->m_MousePos)*OffsetAmount;
			}
			
			if(Config()->m_ClCameraSmoothness > 0)
				s_CurrentCameraOffset += (TargetCameraOffset - s_CurrentCameraOffset) * minimum(DeltaTime * s_SpeedBias, 1.0f);
			else
				s_CurrentCameraOffset = TargetCameraOffset;
			
			if(m_pClient->m_Snap.m_SpecInfo.m_Active)
				m_Center = m_pClient->m_Snap.m_SpecInfo.m_Position + s_CurrentCameraOffset;
			else
				m_Center = m_pClient->m_LocalCharacterPos + s_CurrentCameraOffset;
		}
	}
	else
	{
		m_Zoom = 0.7f;
		static vec2 Dir = vec2(1.0f, 0.0f);

		if(distance(m_Center, m_RotationCenter) <= (float)Config()->m_ClRotationRadius+0.5f)
		{
			// do little rotation
			float RotPerTick = 360.0f/(float)Config()->m_ClRotationSpeed * Client()->RenderFrameTime();
			Dir = rotate(Dir, RotPerTick);
			m_Center = m_RotationCenter+Dir*(float)Config()->m_ClRotationRadius;
		}
		else
		{
			// positions for the animation
			Dir = normalize(m_AnimationStartPos - m_RotationCenter);
			vec2 TargetPos = m_RotationCenter + Dir * (float)Config()->m_ClRotationRadius;
			float Distance = distance(m_AnimationStartPos, TargetPos);

			// move time
			m_MoveTime += Client()->RenderFrameTime()*Config()->m_ClCameraSpeed / 10.0f;
			float XVal = 1 - m_MoveTime;
			XVal = pow(XVal, 7.0f);

			m_Center = TargetPos + Dir * (XVal*Distance);
		}
	}

	m_PrevCenter = m_Center;
}